

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

void __thiscall
apngasm_cli::Options::putHelpTo(Options *this,basic_ostream<char,_std::char_traits<char>_> *out)

{
  long *plVar1;
  
  putVersionTo(this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "===============================================================================\n\n",
             0x51);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "ALLOWED OPTIONS\n-------------------------------------------------------------------------------\n"
             ,0x60);
  plVar1 = (long *)boost::program_options::operator<<(out,&this->visible_opts);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "EXAMPLE\n-------------------------------------------------------------------------------\n\nAssemble an APNG:\n\n    apngasm -o outfile.png frame1.png frame2.png frame3.png [options]\n    apngasm -o outfile.png frame*.png [options]\n\nAssemble an APNG with specific frame delays in miliseconds:\n\n    apngasm -o outfile.png frame1.png 200 frame2.png 100 [options]\n\nAssemble an APNG with specific frame delays in fractions of a second:\n\n    apngasm -o outfile.png frame1.png 1:2 frame2.png 3:5 [options]\n\nDisassemble an APNG file into frames and JSON/XML directive files:\n\n    apngasm -o output_dir -D apng_file.png\n"
             ,0x25e);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void Options::putHelpTo(std::basic_ostream<char> &out) const {
  putVersionTo(out);
  out << "====================================================================="
         "==========\n\n";
  out << ("ALLOWED OPTIONS\n"
          "--------------------------------------------------------------------"
          "-----------\n");

  out << visible_opts << std::endl;
  out << ("EXAMPLE\n"
          "--------------------------------------------------------------------"
          "-----------\n"
          "\nAssemble an APNG:\n\n"
          "    apngasm -o outfile.png frame1.png frame2.png frame3.png "
          "[options]\n"
          "    apngasm -o outfile.png frame*.png [options]\n"
          "\nAssemble an APNG with specific frame delays in miliseconds:\n\n"
          "    apngasm -o outfile.png frame1.png 200 frame2.png 100 [options]\n"
          "\nAssemble an APNG with specific frame delays in fractions of a "
          "second:\n\n"
          "    apngasm -o outfile.png frame1.png 1:2 frame2.png 3:5 [options]\n"
          "\nDisassemble an APNG file into frames and JSON/XML directive "
          "files:\n\n"
          "    apngasm -o output_dir -D apng_file.png\n")
      << std::endl;
}